

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void * coll_seq_insert_before(coll_seq_t *seq,void *data,void *pos)

{
  coll_seq_node_t *pcVar1;
  node_t_conflict *node;
  node_t_conflict *cur;
  node_t_conflict *prev;
  void *pos_local;
  void *data_local;
  coll_seq_t *seq_local;
  
  if (seq != (coll_seq_t *)0x0) {
    cur = (node_t_conflict *)0x0;
    for (node = seq->head; node != (node_t_conflict *)0x0; node = node->next) {
      if (node->data == pos) {
        pcVar1 = (coll_seq_node_t *)malloc(0x10);
        pcVar1->data = data;
        pcVar1->next = node;
        if (cur == (node_t_conflict *)0x0) {
          seq->head = pcVar1;
        }
        else {
          cur->next = pcVar1;
        }
        seq->len = seq->len + 1;
        return data;
      }
      cur = node;
    }
  }
  return (void *)0x0;
}

Assistant:

void *coll_seq_insert_before(coll_seq_t *seq, void *data, void *pos) {
    if (!seq) {
        return NULL;
    }
    node_t *prev = NULL, *cur = seq->head;
    while (cur) {
        if (cur->data == pos) {
            node_t *node = malloc(sizeof(node_t));
            node->data = data;
            node->next = cur;
            if (prev) {
                prev->next = node;
            } else {
                seq->head = node;
            }
            ++(seq->len);
            return data;
        }
        prev = cur;
        cur = cur->next;
    }
    return NULL;
}